

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.c
# Opt level: O2

sysbvm_tuple_t
sysbvm_astMakeDictionaryNode_primitiveEvaluate
          (sysbvm_context_t *context,sysbvm_tuple_t closure,size_t argumentCount,
          sysbvm_tuple_t *arguments)

{
  ulong uVar1;
  size_t i;
  size_t sVar2;
  size_t expectedCapacity;
  anon_struct_24_3_7e98202e gcFrame;
  sysbvm_stackFrameSourcePositionRecord_t sourcePositionRecord;
  sysbvm_stackFrameRecord_t local_48;
  undefined8 local_38;
  undefined1 *local_30;
  
  if (argumentCount != 2) {
    sysbvm_error_argumentCountMismatch(2,argumentCount);
  }
  gcFrame.result = 0;
  gcFrame.element = 0;
  gcFrame.expression = 0;
  local_48.previous = (sysbvm_stackFrameRecord_s *)0x0;
  local_48.type = SYSBVM_STACK_FRAME_RECORD_TYPE_GC_ROOTS;
  local_48._12_4_ = 0;
  local_38 = 3;
  local_30 = (undefined1 *)&gcFrame;
  sysbvm_stackFrame_pushRecord(&local_48);
  sourcePositionRecord.previous = (sysbvm_stackFrameRecord_t *)0x0;
  sourcePositionRecord.type = SYSBVM_STACK_FRAME_RECORD_TYPE_SOURCE_POSITION;
  sourcePositionRecord.sourcePosition = *(sysbvm_tuple_t *)(*arguments + 0x10);
  sysbvm_stackFrame_pushRecord((sysbvm_stackFrameRecord_t *)&sourcePositionRecord);
  uVar1 = *(ulong *)(*arguments + 0x28);
  if ((uVar1 & 0xf) == 0 && uVar1 != 0) {
    expectedCapacity = (size_t)(*(uint *)(uVar1 + 0xc) >> 3);
  }
  else {
    expectedCapacity = 0;
  }
  gcFrame.result = sysbvm_dictionary_createWithCapacity(context,expectedCapacity);
  for (sVar2 = 0; expectedCapacity != sVar2; sVar2 = sVar2 + 1) {
    uVar1 = *(ulong *)(*arguments + 0x28);
    if ((uVar1 & 0xf) == 0 && uVar1 != 0) {
      gcFrame.expression = *(sysbvm_tuple_t *)(uVar1 + 0x10 + sVar2 * 8);
    }
    else {
      gcFrame.expression = 0;
    }
    gcFrame.element =
         sysbvm_interpreter_evaluateASTWithEnvironment(context,gcFrame.expression,arguments[1]);
    sysbvm_dictionary_add(context,gcFrame.result,gcFrame.element);
  }
  sysbvm_stackFrame_popRecord((sysbvm_stackFrameRecord_t *)&sourcePositionRecord);
  sysbvm_stackFrame_popRecord(&local_48);
  return gcFrame.result;
}

Assistant:

static sysbvm_tuple_t sysbvm_astMakeDictionaryNode_primitiveEvaluate(sysbvm_context_t *context, sysbvm_tuple_t closure, size_t argumentCount, sysbvm_tuple_t *arguments)
{
    (void)closure;
    if(argumentCount != 2) sysbvm_error_argumentCountMismatch(2, argumentCount);

    sysbvm_tuple_t *node = &arguments[0];
    sysbvm_tuple_t *environment = &arguments[1];

    sysbvm_astMakeDictionaryNode_t **dictionaryNode = (sysbvm_astMakeDictionaryNode_t**)node;

    struct {
        sysbvm_tuple_t result;
        sysbvm_tuple_t element;
        sysbvm_tuple_t expression;
    } gcFrame = {0};

    SYSBVM_STACKFRAME_PUSH_GC_ROOTS(gcFrameRecord, gcFrame);
    SYSBVM_STACKFRAME_PUSH_SOURCE_POSITION(sourcePositionRecord, (*dictionaryNode)->super.sourcePosition);

    size_t expressionCount = sysbvm_array_getSize((*dictionaryNode)->elements);
    gcFrame.result = sysbvm_dictionary_createWithCapacity(context, expressionCount);
    for(size_t i = 0; i < expressionCount; ++i)
    {
        gcFrame.expression = sysbvm_array_at((*dictionaryNode)->elements, i);
        gcFrame.element = sysbvm_interpreter_evaluateASTWithEnvironment(context, gcFrame.expression, *environment);
        sysbvm_dictionary_add(context, gcFrame.result, gcFrame.element);
    }

    SYSBVM_STACKFRAME_POP_SOURCE_POSITION(sourcePositionRecord);
    SYSBVM_STACKFRAME_POP_GC_ROOTS(gcFrameRecord);
    return gcFrame.result;
}